

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsParticle_dns.c
# Opt level: O3

int Proj(sunrealtype t,N_Vector ycur,N_Vector corr,sunrealtype epsProj,N_Vector err,void *user_data)

{
  undefined1 auVar1 [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  
  pauVar2 = (undefined1 (*) [16])N_VGetArrayPointer(t,SUB84(epsProj,0));
  pauVar3 = (undefined1 (*) [16])N_VGetArrayPointer(corr);
  auVar8 = *pauVar2;
  dVar5 = auVar8._0_8_;
  dVar6 = auVar8._8_8_;
  dVar7 = SQRT(dVar5 * dVar5 + dVar6 * dVar6);
  auVar1._8_4_ = SUB84(dVar7,0);
  auVar1._0_8_ = dVar7;
  auVar1._12_4_ = (int)((ulong)dVar7 >> 0x20);
  auVar8 = divpd(auVar8,auVar1);
  dVar7 = auVar8._0_8_;
  dVar9 = auVar8._8_8_;
  auVar8._8_4_ = SUB84(dVar9 - dVar6,0);
  auVar8._0_8_ = dVar7 - dVar5;
  auVar8._12_4_ = (int)((ulong)(dVar9 - dVar6) >> 0x20);
  *pauVar3 = auVar8;
  if (err != (N_Vector)0x0) {
    pdVar4 = (double *)N_VGetArrayPointer(err);
    dVar5 = *pdVar4;
    *pdVar4 = dVar9 * dVar5 * dVar9 + -(pdVar4[1] * dVar7) * dVar9;
    pdVar4[1] = dVar9 * -dVar5 * dVar7 + pdVar4[1] * dVar7 * dVar7;
  }
  return 0;
}

Assistant:

static int Proj(sunrealtype t, N_Vector ycur, N_Vector corr,
                sunrealtype epsProj, N_Vector err, void* user_data)
{
  sunrealtype* ydata = N_VGetArrayPointer(ycur);
  sunrealtype* cdata = N_VGetArrayPointer(corr);
  sunrealtype* edata = NULL;
  sunrealtype x      = ydata[0];
  sunrealtype y      = ydata[1];
  sunrealtype xp, yp, r;
  sunrealtype errxp, erryp;

  /* project onto the unit circle */
  r = SQRT(x * x + y * y);

  xp = x / r;
  yp = y / r;

  /* correction to the unprojected solution */
  cdata[0] = xp - x;
  cdata[1] = yp - y;

  /* project the error */
  if (err != NULL)
  {
    edata = N_VGetArrayPointer(err);

    errxp = edata[0] * yp * yp - edata[1] * xp * yp;
    erryp = -edata[0] * xp * yp + edata[1] * xp * xp;

    edata[0] = errxp;
    edata[1] = erryp;
  }

  return (0);
}